

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget_p.h
# Opt level: O1

void __thiscall QListWidgetPrivate::QListWidgetPrivate(QListWidgetPrivate *this)

{
  long lVar1;
  
  QListViewPrivate::QListViewPrivate(&this->super_QListViewPrivate);
  *(undefined ***)
   &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.super_QAbstractScrollAreaPrivate.
    super_QFramePrivate.super_QWidgetPrivate = &PTR__QListWidgetPrivate_0081c9f8;
  *(undefined4 *)&(this->super_QListViewPrivate).field_0x5bc = 0;
  lVar1 = 0;
  this->sortingEnabled = false;
  (this->supportedDragActions).super__Optional_base<QFlags<Qt::DropAction>,_true,_true>._M_payload.
  super__Optional_payload_base<QFlags<Qt::DropAction>_>._M_engaged = false;
  do {
    QMetaObject::Connection::Connection
              ((Connection *)
               (&((array<QMetaObject::Connection,_8UL> *)(&this->selectionModelConnections + -4))->
                 field_0x0 + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x40);
  lVar1 = 0;
  do {
    QMetaObject::Connection::Connection
              ((Connection *)((long)&(this->selectionModelConnections)._M_elems[0].d_ptr + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

QListWidgetPrivate() : QListViewPrivate(), sortOrder(Qt::AscendingOrder), sortingEnabled(false) {}